

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlDOMWrapCloneNode(xmlDOMWrapCtxtPtr_conflict ctxt,xmlDocPtr sourceDoc,xmlNodePtr node,
                       xmlNodePtr *resNode,xmlDocPtr destDoc,xmlNodePtr destParent,int deep,
                       int options)

{
  xmlElementType xVar1;
  _xmlDoc *p_Var2;
  _xmlNs **pp_Var3;
  _xmlDict *dict;
  int iVar4;
  int iVar5;
  _xmlDoc *p_Var6;
  xmlChar *name;
  xmlEntityPtr name_00;
  xmlNsPtr newNs;
  xmlNsMapItemPtr_conflict pxVar7;
  xmlChar *pxVar8;
  _xmlNode *p_Var9;
  xmlNsPtr *retNs;
  xmlNsMapItemPtr_conflict pxVar10;
  xmlNs *ns;
  int iVar11;
  xmlNodePtr elem;
  xmlNsMapItemPtr pxVar12;
  char *extra;
  _xmlDoc *p_Var13;
  xmlNsPtr pxVar14;
  _xmlNode *attr;
  xmlDocPtr doc;
  _xmlDoc *p_Var15;
  bool bVar16;
  long lStackY_a0;
  xmlNsMapPtr nsMap;
  int local_74;
  xmlNsPtr local_70;
  _xmlDict *local_68;
  _xmlDoc *local_60;
  xmlIDPtr local_58;
  xmlDocPtr local_50;
  xmlNodePtr local_48;
  xmlNodePtr local_40;
  _xmlDoc *local_38;
  
  nsMap = (xmlNsMapPtr)0x0;
  iVar11 = -1;
  if (destDoc != (xmlDocPtr)0x0 && (resNode != (xmlNodePtr *)0x0 && node != (xmlNodePtr)0x0)) {
    if (node->type == XML_ELEMENT_NODE) {
      p_Var6 = node->doc;
      if ((p_Var6 == sourceDoc || p_Var6 == (_xmlDoc *)0x0) || sourceDoc == (xmlDocPtr)0x0) {
        local_38 = sourceDoc;
        if (sourceDoc == (xmlDocPtr)0x0) {
          local_38 = p_Var6;
        }
        if (sourceDoc != (xmlDocPtr)0x0 || p_Var6 != (_xmlDoc *)0x0) {
          if (ctxt != (xmlDOMWrapCtxtPtr_conflict)0x0) {
            nsMap = (xmlNsMapPtr)ctxt->namespaceMap;
          }
          local_68 = destDoc->dict;
          *resNode = (xmlNodePtr)0x0;
          local_48 = (xmlNodePtr)0x0;
          iVar11 = -1;
          local_74 = 0;
          local_60 = (_xmlDoc *)0x0;
          p_Var6 = (_xmlDoc *)0x0;
          p_Var9 = node;
          local_50 = destDoc;
          local_40 = destParent;
LAB_00184785:
          p_Var15 = (_xmlDoc *)0x0;
LAB_00184788:
          attr = p_Var9;
          if ((attr->doc != local_38) || (xVar1 = attr->type, XML_DOCUMENT_FRAG_NODE < xVar1))
          goto switchD_00184930_caseD_9;
          p_Var13 = p_Var6;
          if ((0x9faU >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
            if (xVar1 == XML_ATTRIBUTE_NODE) {
              p_Var6 = (_xmlDoc *)(*xmlRealloc)((void *)0x0,0x60);
              if (p_Var6 == (_xmlDoc *)0x0) {
                extra = "xmlDOMWrapCloneNode(): allocating an attr-node";
                goto LAB_00184e36;
              }
              p_Var6->intSubset = (_xmlDtd *)0x0;
              p_Var6->extSubset = (_xmlDtd *)0x0;
              p_Var6->doc = (_xmlDoc *)0x0;
              *(undefined8 *)&p_Var6->compression = 0;
              p_Var6->next = (_xmlNode *)0x0;
              p_Var6->prev = (_xmlNode *)0x0;
              p_Var6->last = (_xmlNode *)0x0;
              p_Var6->parent = (_xmlNode *)0x0;
              p_Var6->name = (char *)0x0;
              p_Var6->children = (_xmlNode *)0x0;
              p_Var6->_private = (_xmlID *)0x0;
              *(xmlChar **)&p_Var6->type = (xmlChar *)0x0;
              if (local_60 == (_xmlDoc *)0x0) goto LAB_0018487d;
              p_Var6->parent = (_xmlNode *)p_Var13;
              if (p_Var15 != (_xmlDoc *)0x0) goto LAB_0018480f;
              p_Var13->extSubset = (_xmlDtd *)p_Var6;
              goto LAB_0018488c;
            }
            goto switchD_00184930_caseD_9;
          }
          p_Var6 = (_xmlDoc *)(*xmlMalloc)(0x78);
          if (p_Var6 == (_xmlDoc *)0x0) {
            extra = "xmlDOMWrapCloneNode(): allocating a node";
LAB_00184e36:
            xmlTreeErrMemory(extra);
            goto switchD_00184930_caseD_9;
          }
          p_Var6->oldNs = (_xmlNs *)0x0;
          p_Var6->version = (xmlChar *)0x0;
          p_Var6->intSubset = (_xmlDtd *)0x0;
          p_Var6->extSubset = (_xmlDtd *)0x0;
          p_Var6->doc = (_xmlDoc *)0x0;
          p_Var6->compression = 0;
          p_Var6->standalone = 0;
          p_Var6->next = (_xmlNode *)0x0;
          p_Var6->prev = (_xmlNode *)0x0;
          p_Var6->last = (_xmlNode *)0x0;
          p_Var6->parent = (_xmlNode *)0x0;
          p_Var6->name = (char *)0x0;
          p_Var6->children = (_xmlNode *)0x0;
          p_Var6->_private = (void *)0x0;
          *(undefined8 *)&p_Var6->type = 0;
          p_Var6->encoding = (xmlChar *)0x0;
          if (local_60 == (_xmlDoc *)0x0) {
LAB_0018487d:
            local_60 = p_Var6;
          }
          else {
            p_Var6->parent = (_xmlNode *)p_Var13;
            if (p_Var15 == (_xmlDoc *)0x0) {
              p_Var13->children = (_xmlNode *)p_Var6;
            }
            else {
LAB_0018480f:
              p_Var15->next = (_xmlNode *)p_Var6;
              p_Var6->prev = (_xmlNode *)p_Var15;
            }
          }
LAB_0018488c:
          doc = local_50;
          p_Var6->type = attr->type;
          p_Var6->doc = local_50;
          pxVar8 = attr->name;
          name = "text";
          if (((pxVar8 == "text") || (name = "textnoenc", pxVar8 == "textnoenc")) ||
             (name = "comment", pxVar8 == "comment")) {
LAB_0018490f:
            p_Var6->name = (char *)name;
          }
          else if (pxVar8 != (xmlChar *)0x0) {
            if (local_68 == (xmlDictPtr)0x0) {
              name = xmlStrdup(pxVar8);
            }
            else {
              iVar4 = xmlDictOwns(local_68,pxVar8);
              name = attr->name;
              if (iVar4 == 0) {
                name = xmlDictLookup(local_68,name,-1);
              }
            }
            goto LAB_0018490f;
          }
          dict = local_68;
          p_Var15 = p_Var6;
          switch(attr->type) {
          case XML_ELEMENT_NODE:
            iVar11 = iVar11 + 1;
            if (attr->nsDef == (xmlNs *)0x0) {
              local_48 = attr;
            }
            else {
              iVar4 = local_74 + (uint)(local_74 == 0);
              if ((local_74 == 0 && ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) &&
                  local_40 != (xmlNodePtr)0x0) {
                iVar5 = xmlDOMWrapNSNormGatherInScopeNs(&nsMap,local_40);
                iVar4 = 1;
                if (iVar5 == -1) goto switchD_00184930_caseD_9;
              }
              local_58 = (xmlIDPtr)resNode;
              local_70 = (xmlNsPtr)&attr->nsDef;
              pxVar14 = (xmlNsPtr)&p_Var6->oldNs;
              local_74 = iVar4;
              while (pp_Var3 = &local_70->next, local_70 = *pp_Var3, *pp_Var3 != (_xmlNs *)0x0) {
                newNs = (xmlNsPtr)(*xmlMalloc)(0x30);
                if (newNs == (xmlNsPtr)0x0) {
                  xmlTreeErrMemory("xmlDOMWrapCloneNode(): allocating namespace");
                  goto switchD_00184930_caseD_13;
                }
                newNs->next = (_xmlNs *)0x0;
                *(undefined8 *)&newNs->type = 0;
                newNs->_private = (void *)0x0;
                newNs->context = (_xmlDoc *)0x0;
                newNs->href = (xmlChar *)0x0;
                newNs->prefix = (xmlChar *)0x0;
                newNs->type = XML_NAMESPACE_DECL;
                if (local_70->href != (xmlChar *)0x0) {
                  pxVar8 = xmlStrdup(local_70->href);
                  newNs->href = pxVar8;
                }
                if (local_70->prefix != (xmlChar *)0x0) {
                  pxVar8 = xmlStrdup(local_70->prefix);
                  newNs->prefix = pxVar8;
                }
                pxVar14->next = newNs;
                pxVar14 = newNs;
                if ((ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) ||
                   (ctxt->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0)) {
                  if ((nsMap != (xmlNsMapPtr)0x0) &&
                     (pxVar7 = nsMap->first, pxVar7 != (xmlNsMapItemPtr_conflict)0x0)) {
                    for (; pxVar7 != (xmlNsMapItemPtr_conflict)0x0; pxVar7 = pxVar7->next) {
                      if ((-2 < pxVar7->depth) && (pxVar7->shadowDepth == -1)) {
                        pxVar8 = pxVar7->newNs->prefix;
                        if ((local_70->prefix == pxVar8) ||
                           (iVar4 = xmlStrEqual(local_70->prefix,pxVar8), iVar4 != 0)) {
                          pxVar7->shadowDepth = iVar11;
                        }
                      }
                    }
                  }
                  pxVar7 = xmlDOMWrapNsMapAddItem(&nsMap,-1,local_70,newNs,iVar11);
                  resNode = (xmlNodePtr *)local_58;
                  if (pxVar7 == (xmlNsMapItemPtr_conflict)0x0) goto switchD_00184930_caseD_9;
                }
              }
              local_48 = attr;
              resNode = (xmlNodePtr *)local_58;
              doc = local_50;
            }
          case XML_ATTRIBUTE_NODE:
            if (attr->ns == (xmlNs *)0x0) {
LAB_00184c85:
              if ((((p_Var6->type == XML_ATTRIBUTE_NODE) && (p_Var6->parent != (xmlNodePtr)0x0)) &&
                  (iVar4 = xmlIsID(local_50,p_Var6->parent,(xmlAttrPtr)p_Var6), iVar4 != 0)) &&
                 (pxVar8 = xmlNodeListGetString(attr->doc,attr->children,1),
                 pxVar8 != (xmlChar *)0x0)) {
                local_58 = xmlAddID((xmlValidCtxtPtr)0x0,local_50,pxVar8,(xmlAttrPtr)attr);
                (*xmlFree)(pxVar8);
                if (local_58 == (xmlIDPtr)0x0) goto switchD_00184930_caseD_9;
              }
              if (attr->type == XML_ELEMENT_NODE) goto code_r0x00184cf3;
              goto LAB_00184d33;
            }
            bVar16 = local_74 == 0;
            local_74 = local_74 + (uint)(local_74 == 0);
            if ((bVar16 && ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) && local_40 != (xmlNodePtr)0x0)
            {
              iVar4 = xmlDOMWrapNSNormGatherInScopeNs(&nsMap,local_40);
              local_74 = 1;
              if (iVar4 != -1) goto LAB_00184bb4;
switchD_00184930_caseD_9:
              iVar11 = -1;
LAB_00184e45:
              if (nsMap != (xmlNsMapPtr)0x0) {
                if (ctxt != (xmlDOMWrapCtxtPtr_conflict)0x0) {
LAB_00184e59:
                  if ((xmlNsMapPtr)ctxt->namespaceMap == nsMap) {
                    pxVar7 = nsMap->first;
                    if (pxVar7 != (xmlNsMapItemPtr_conflict)0x0) {
                      if (nsMap->pool != (xmlNsMapItemPtr_conflict)0x0) {
                        nsMap->last->next = nsMap->pool;
                        pxVar7 = nsMap->first;
                      }
                      nsMap->pool = pxVar7;
                      nsMap->first = (xmlNsMapItemPtr_conflict)0x0;
                    }
                    goto LAB_00184e64;
                  }
                }
                xmlDOMWrapNsMapFree(nsMap);
              }
            }
            else {
LAB_00184bb4:
              if ((nsMap != (xmlNsMapPtr)0x0) &&
                 (pxVar7 = nsMap->first, pxVar7 != (xmlNsMapItemPtr_conflict)0x0)) {
                for (; pxVar7 != (xmlNsMapItemPtr_conflict)0x0; pxVar7 = pxVar7->next) {
                  if ((pxVar7->shadowDepth == -1) && (attr->ns == pxVar7->oldNs)) {
                    retNs = &pxVar7->newNs;
                    goto LAB_00184c7e;
                  }
                }
              }
              if (ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) {
                ns = attr->ns;
LAB_00184c3c:
                elem = local_48;
                if (local_40 == (xmlNodePtr)0x0) {
                  elem = (xmlNodePtr)0x0;
                }
                retNs = &local_70;
                iVar4 = xmlDOMWrapNSNormAcquireNormalizedNs
                                  (doc,elem,ns,retNs,&nsMap,iVar11,
                                   (uint)(attr->type == XML_ATTRIBUTE_NODE),(int)p_Var13);
                if (iVar4 != -1) {
LAB_00184c7e:
                  *(xmlNsPtr *)&p_Var6->compression = *retNs;
                  goto LAB_00184c85;
                }
                goto switchD_00184930_caseD_9;
              }
              ns = attr->ns;
              if (ctxt->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0) goto LAB_00184c3c;
              local_70 = (*ctxt->getNsForNodeFunc)(ctxt,attr,ns->href,ns->prefix);
              pxVar7 = xmlDOMWrapNsMapAddItem(&nsMap,-1,attr->ns,local_70,-4);
              retNs = &local_70;
              if (pxVar7 != (xmlNsMapItemPtr_conflict)0x0) goto LAB_00184c7e;
              iVar11 = -1;
              if (nsMap != (xmlNsMapPtr)0x0) goto LAB_00184e59;
            }
LAB_00184e64:
            ((xmlIDPtr)resNode)->next = (_xmlID *)local_60;
            break;
          case XML_TEXT_NODE:
          case XML_CDATA_SECTION_NODE:
          case XML_PI_NODE:
          case XML_COMMENT_NODE:
            pxVar8 = attr->content;
            if (pxVar8 == (xmlChar *)0x0) goto switchD_00184930_caseD_6;
            if (local_68 == (xmlDictPtr)0x0) {
              name_00 = (xmlEntityPtr)xmlStrdup(pxVar8);
            }
            else {
              iVar4 = xmlDictOwns(local_68,pxVar8);
              name_00 = (xmlEntityPtr)attr->content;
              if (iVar4 == 0) {
                name_00 = (xmlEntityPtr)xmlDictLookup(dict,(xmlChar *)name_00,-1);
              }
            }
            lStackY_a0 = 0x50;
            goto LAB_00184b2a;
          case XML_ENTITY_REF_NODE:
            if (local_38 == doc) {
              p_Var6->intSubset = (_xmlDtd *)attr->content;
              p_Var6->children = attr->children;
              name_00 = (xmlEntityPtr)attr->last;
              lStackY_a0 = 0x20;
            }
            else {
              if ((doc->intSubset == (_xmlDtd *)0x0) && (doc->extSubset == (_xmlDtd *)0x0))
              goto switchD_00184930_caseD_6;
              name_00 = xmlGetDocEntity(doc,attr->name);
              if (name_00 == (xmlEntityPtr)0x0) goto switchD_00184930_caseD_6;
              p_Var6->intSubset = (_xmlDtd *)name_00->content;
              p_Var6->children = (_xmlNode *)name_00;
              lStackY_a0 = 0x20;
            }
LAB_00184b2a:
            *(xmlEntityPtr *)((long)&p_Var6->_private + lStackY_a0) = name_00;
            goto switchD_00184930_caseD_6;
          case XML_ENTITY_NODE:
            goto switchD_00184930_caseD_6;
          default:
            goto switchD_00184930_caseD_9;
          case XML_XINCLUDE_START:
          case XML_XINCLUDE_END:
switchD_00184930_caseD_13:
            iVar11 = -1;
          }
        }
      }
    }
    else {
      iVar11 = 1;
    }
  }
  return iVar11;
code_r0x00184cf3:
  p_Var15 = (_xmlDoc *)0x0;
  p_Var9 = (xmlNodePtr)attr->properties;
  if ((xmlNodePtr)attr->properties == (xmlNodePtr)0x0) {
LAB_00184d33:
    for (; (p_Var9 = attr->children, p_Var15 = p_Var6, p_Var9 == (_xmlNode *)0x0 ||
           ((deep == 0 && (attr->type != XML_ATTRIBUTE_NODE)))); attr = attr->parent) {
switchD_00184930_caseD_6:
      while( true ) {
        p_Var6 = p_Var13;
        if (attr == node) {
          iVar11 = 0;
          goto LAB_00184e45;
        }
        xVar1 = attr->type;
        if ((xVar1 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
           ((0x180002U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
          if ((nsMap != (xmlNsMapPtr)0x0) && (nsMap->first != (xmlNsMapItemPtr_conflict)0x0)) {
            while ((pxVar7 = nsMap->last, pxVar10 = (xmlNsMapItemPtr_conflict)nsMap,
                   pxVar7 != (xmlNsMapItemPtr_conflict)0x0 && (iVar11 <= pxVar7->depth))) {
              pxVar12 = pxVar7->prev;
              nsMap->last = pxVar12;
              if (pxVar12 == (xmlNsMapItemPtr)0x0) {
                pxVar12 = (xmlNsMapItemPtr)nsMap;
              }
              pxVar12->next = (xmlNsMapItemPtr_conflict)0x0;
              pxVar7->next = nsMap->pool;
              nsMap->pool = pxVar7;
            }
            while (pxVar10 = pxVar10->next, pxVar10 != (xmlNsMapItemPtr_conflict)0x0) {
              if (iVar11 <= pxVar10->shadowDepth) {
                pxVar10->shadowDepth = -1;
              }
            }
          }
          iVar11 = iVar11 + -1;
        }
        p_Var9 = attr->next;
        if (attr->next != (_xmlNode *)0x0) goto LAB_00184788;
        p_Var2 = (_xmlDoc *)p_Var15->parent;
        if (xVar1 == XML_ATTRIBUTE_NODE) break;
        if (p_Var2 != (_xmlDoc *)0x0) {
          p_Var2->last = (_xmlNode *)p_Var15;
          p_Var6 = (_xmlDoc *)p_Var2->parent;
        }
        attr = attr->parent;
        p_Var15 = p_Var2;
        p_Var13 = p_Var6;
      }
      p_Var13 = (_xmlDoc *)p_Var2->parent;
      p_Var6 = p_Var2;
    }
    goto LAB_00184785;
  }
  goto LAB_00184788;
}

Assistant:

int
xmlDOMWrapCloneNode(xmlDOMWrapCtxtPtr ctxt,
		      xmlDocPtr sourceDoc,
		      xmlNodePtr node,
		      xmlNodePtr *resNode,
		      xmlDocPtr destDoc,
		      xmlNodePtr destParent,
		      int deep,
		      int options ATTRIBUTE_UNUSED)
{
    int ret = 0;
    xmlNodePtr cur, curElem = NULL;
    xmlNsMapPtr nsMap = NULL;
    xmlNsMapItemPtr mi;
    xmlNsPtr ns;
    int depth = -1;
    /* int adoptStr = 1; */
    /* gather @parent's ns-decls. */
    int parnsdone = 0;
    /*
    * @ancestorsOnly:
    * TODO: @ancestorsOnly should be set per option.
    *
    */
    int ancestorsOnly = 0;
    xmlNodePtr resultClone = NULL, clone = NULL, parentClone = NULL, prevClone = NULL;
    xmlNsPtr cloneNs = NULL, *cloneNsDefSlot = NULL;
    xmlDictPtr dict; /* The destination dict */

    if ((node == NULL) || (resNode == NULL) || (destDoc == NULL))
	return(-1);
    /*
    * TODO: Initially we support only element-nodes.
    */
    if (node->type != XML_ELEMENT_NODE)
	return(1);
    /*
    * Check node->doc sanity.
    */
    if ((node->doc != NULL) && (sourceDoc != NULL) &&
	(node->doc != sourceDoc)) {
	/*
	* Might be an XIncluded node.
	*/
	return (-1);
    }
    if (sourceDoc == NULL)
	sourceDoc = node->doc;
    if (sourceDoc == NULL)
        return (-1);

    dict = destDoc->dict;
    /*
    * Reuse the namespace map of the context.
    */
    if (ctxt)
	nsMap = (xmlNsMapPtr) ctxt->namespaceMap;

    *resNode = NULL;

    cur = node;
    if ((cur != NULL) && (cur->type == XML_NAMESPACE_DECL))
        return(-1);

    while (cur != NULL) {
	if (cur->doc != sourceDoc) {
	    /*
	    * We'll assume XIncluded nodes if the doc differs.
	    * TODO: Do we need to reconciliate XIncluded nodes?
	    * TODO: This here returns -1 in this case.
	    */
	    goto internal_error;
	}
	/*
	* Create a new node.
	*/
	switch (cur->type) {
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		/*
		* TODO: What to do with XInclude?
		*/
		goto internal_error;
		break;
	    case XML_ELEMENT_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
	    case XML_COMMENT_NODE:
	    case XML_PI_NODE:
	    case XML_DOCUMENT_FRAG_NODE:
	    case XML_ENTITY_REF_NODE:
	    case XML_ENTITY_NODE:
		/*
		* Nodes of xmlNode structure.
		*/
		clone = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
		if (clone == NULL) {
		    xmlTreeErrMemory("xmlDOMWrapCloneNode(): allocating a node");
		    goto internal_error;
		}
		memset(clone, 0, sizeof(xmlNode));
		/*
		* Set hierarchical links.
		*/
		if (resultClone != NULL) {
		    clone->parent = parentClone;
		    if (prevClone) {
			prevClone->next = clone;
			clone->prev = prevClone;
		    } else
			parentClone->children = clone;
		} else
		    resultClone = clone;

		break;
	    case XML_ATTRIBUTE_NODE:
		/*
		* Attributes (xmlAttr).
		*/
                /* Use xmlRealloc to avoid -Warray-bounds warning */
		clone = (xmlNodePtr) xmlRealloc(NULL, sizeof(xmlAttr));
		if (clone == NULL) {
		    xmlTreeErrMemory("xmlDOMWrapCloneNode(): allocating an attr-node");
		    goto internal_error;
		}
		memset(clone, 0, sizeof(xmlAttr));
		/*
		* Set hierarchical links.
		* TODO: Change this to add to the end of attributes.
		*/
		if (resultClone != NULL) {
		    clone->parent = parentClone;
		    if (prevClone) {
			prevClone->next = clone;
			clone->prev = prevClone;
		    } else
			parentClone->properties = (xmlAttrPtr) clone;
		} else
		    resultClone = clone;
		break;
	    default:
		/*
		* TODO QUESTION: Any other nodes expected?
		*/
		goto internal_error;
	}

	clone->type = cur->type;
	clone->doc = destDoc;

	/*
	* Clone the name of the node if any.
	*/
	if (cur->name == xmlStringText)
	    clone->name = xmlStringText;
	else if (cur->name == xmlStringTextNoenc)
	    /*
	    * NOTE: Although xmlStringTextNoenc is never assigned to a node
	    *   in tree.c, it might be set in Libxslt via
	    *   "xsl:disable-output-escaping".
	    */
	    clone->name = xmlStringTextNoenc;
	else if (cur->name == xmlStringComment)
	    clone->name = xmlStringComment;
	else if (cur->name != NULL) {
	    DICT_CONST_COPY(cur->name, clone->name);
	}

	switch (cur->type) {
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		/*
		* TODO
		*/
		return (-1);
	    case XML_ELEMENT_NODE:
		curElem = cur;
		depth++;
		/*
		* Namespace declarations.
		*/
		if (cur->nsDef != NULL) {
		    if (! parnsdone) {
			if (destParent && (ctxt == NULL)) {
			    /*
			    * Gather @parent's in-scope ns-decls.
			    */
			    if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
				destParent) == -1)
				goto internal_error;
			}
			parnsdone = 1;
		    }
		    /*
		    * Clone namespace declarations.
		    */
		    cloneNsDefSlot = &(clone->nsDef);
		    for (ns = cur->nsDef; ns != NULL; ns = ns->next) {
			/*
			* Create a new xmlNs.
			*/
			cloneNs = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
			if (cloneNs == NULL) {
			    xmlTreeErrMemory("xmlDOMWrapCloneNode(): "
				"allocating namespace");
			    return(-1);
			}
			memset(cloneNs, 0, sizeof(xmlNs));
			cloneNs->type = XML_LOCAL_NAMESPACE;

			if (ns->href != NULL)
			    cloneNs->href = xmlStrdup(ns->href);
			if (ns->prefix != NULL)
			    cloneNs->prefix = xmlStrdup(ns->prefix);

			*cloneNsDefSlot = cloneNs;
			cloneNsDefSlot = &(cloneNs->next);

			/*
			* Note that for custom handling of ns-references,
			* the ns-decls need not be stored in the ns-map,
			* since they won't be referenced by node->ns.
			*/
			if ((ctxt == NULL) ||
			    (ctxt->getNsForNodeFunc == NULL))
			{
			    /*
			    * Does it shadow any ns-decl?
			    */
			    if (XML_NSMAP_NOTEMPTY(nsMap)) {
				XML_NSMAP_FOREACH(nsMap, mi) {
				    if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
					(mi->shadowDepth == -1) &&
					((ns->prefix == mi->newNs->prefix) ||
					xmlStrEqual(ns->prefix,
					mi->newNs->prefix))) {
					/*
					* Mark as shadowed at the current
					* depth.
					*/
					mi->shadowDepth = depth;
				    }
				}
			    }
			    /*
			    * Push mapping.
			    */
			    if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
				ns, cloneNs, depth) == NULL)
				goto internal_error;
			}
		    }
		}
		/* cur->ns will be processed further down. */
		break;
	    case XML_ATTRIBUTE_NODE:
		/* IDs will be processed further down. */
		/* cur->ns will be processed further down. */
		break;
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
		/*
		* Note that this will also cover the values of attributes.
		*/
		DICT_COPY(cur->content, clone->content);
		goto leave_node;
	    case XML_ENTITY_NODE:
		/* TODO: What to do here? */
		goto leave_node;
	    case XML_ENTITY_REF_NODE:
		if (sourceDoc != destDoc) {
		    if ((destDoc->intSubset) || (destDoc->extSubset)) {
			xmlEntityPtr ent;
			/*
			* Different doc: Assign new entity-node if available.
			*/
			ent = xmlGetDocEntity(destDoc, cur->name);
			if (ent != NULL) {
			    clone->content = ent->content;
			    clone->children = (xmlNodePtr) ent;
			    clone->last = (xmlNodePtr) ent;
			}
		    }
		} else {
		    /*
		    * Same doc: Use the current node's entity declaration
		    * and value.
		    */
		    clone->content = cur->content;
		    clone->children = cur->children;
		    clone->last = cur->last;
		}
		goto leave_node;
	    case XML_PI_NODE:
		DICT_COPY(cur->content, clone->content);
		goto leave_node;
	    case XML_COMMENT_NODE:
		DICT_COPY(cur->content, clone->content);
		goto leave_node;
	    default:
		goto internal_error;
	}

	if (cur->ns == NULL)
	    goto end_ns_reference;

/* handle_ns_reference: */
	/*
	** The following will take care of references to ns-decls ********
	** and is intended only for element- and attribute-nodes.
	**
	*/
	if (! parnsdone) {
	    if (destParent && (ctxt == NULL)) {
		if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap, destParent) == -1)
		    goto internal_error;
	    }
	    parnsdone = 1;
	}
	/*
	* Adopt ns-references.
	*/
	if (XML_NSMAP_NOTEMPTY(nsMap)) {
	    /*
	    * Search for a mapping.
	    */
	    XML_NSMAP_FOREACH(nsMap, mi) {
		if ((mi->shadowDepth == -1) &&
		    (cur->ns == mi->oldNs)) {
		    /*
		    * This is the nice case: a mapping was found.
		    */
		    clone->ns = mi->newNs;
		    goto end_ns_reference;
		}
	    }
	}
	/*
	* No matching namespace in scope. We need a new one.
	*/
	if ((ctxt != NULL) && (ctxt->getNsForNodeFunc != NULL)) {
	    /*
	    * User-defined behaviour.
	    */
	    ns = ctxt->getNsForNodeFunc(ctxt, cur,
		cur->ns->href, cur->ns->prefix);
	    /*
	    * Add user's mapping.
	    */
	    if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
		cur->ns, ns, XML_TREE_NSMAP_CUSTOM) == NULL)
		goto internal_error;
	    clone->ns = ns;
	} else {
	    /*
	    * Acquire a normalized ns-decl and add it to the map.
	    */
	    if (xmlDOMWrapNSNormAcquireNormalizedNs(destDoc,
		/* ns-decls on curElem or on destDoc->oldNs */
		destParent ? curElem : NULL,
		cur->ns, &ns,
		&nsMap, depth,
		/* if we need to search only in the ancestor-axis */
		ancestorsOnly,
		/* ns-decls must be prefixed for attributes. */
		(cur->type == XML_ATTRIBUTE_NODE) ? 1 : 0) == -1)
		goto internal_error;
	    clone->ns = ns;
	}

end_ns_reference:

	/*
	* Some post-processing.
	*
	* Handle ID attributes.
	*/
	if ((clone->type == XML_ATTRIBUTE_NODE) &&
	    (clone->parent != NULL))
	{
	    if (xmlIsID(destDoc, clone->parent, (xmlAttrPtr) clone)) {

		xmlChar *idVal;

		idVal = xmlNodeListGetString(cur->doc, cur->children, 1);
		if (idVal != NULL) {
		    if (xmlAddID(NULL, destDoc, idVal, (xmlAttrPtr) cur) == NULL) {
			/* TODO: error message. */
			xmlFree(idVal);
			goto internal_error;
		    }
		    xmlFree(idVal);
		}
	    }
	}
	/*
	**
	** The following will traverse the tree **************************
	**
	*
	* Walk the element's attributes before descending into child-nodes.
	*/
	if ((cur->type == XML_ELEMENT_NODE) && (cur->properties != NULL)) {
	    prevClone = NULL;
	    parentClone = clone;
	    cur = (xmlNodePtr) cur->properties;
	    continue;
	}
into_content:
	/*
	* Descend into child-nodes.
	*/
	if (cur->children != NULL) {
	    if (deep || (cur->type == XML_ATTRIBUTE_NODE)) {
		prevClone = NULL;
		parentClone = clone;
		cur = cur->children;
		continue;
	    }
	}

leave_node:
	/*
	* At this point we are done with the node, its content
	* and an element-nodes's attribute-nodes.
	*/
	if (cur == node)
	    break;
	if ((cur->type == XML_ELEMENT_NODE) ||
	    (cur->type == XML_XINCLUDE_START) ||
	    (cur->type == XML_XINCLUDE_END)) {
	    /*
	    * TODO: Do we expect nsDefs on XML_XINCLUDE_START?
	    */
	    if (XML_NSMAP_NOTEMPTY(nsMap)) {
		/*
		* Pop mappings.
		*/
		while ((nsMap->last != NULL) &&
		    (nsMap->last->depth >= depth))
		{
		    XML_NSMAP_POP(nsMap, mi)
		}
		/*
		* Unshadow.
		*/
		XML_NSMAP_FOREACH(nsMap, mi) {
		    if (mi->shadowDepth >= depth)
			mi->shadowDepth = -1;
		}
	    }
	    depth--;
	}
	if (cur->next != NULL) {
	    prevClone = clone;
	    cur = cur->next;
	} else if (cur->type != XML_ATTRIBUTE_NODE) {
	    /*
	    * Set clone->last.
	    */
	    if (clone->parent != NULL)
		clone->parent->last = clone;
	    clone = clone->parent;
	    if (clone != NULL)
		parentClone = clone->parent;
	    /*
	    * Process parent --> next;
	    */
	    cur = cur->parent;
	    goto leave_node;
	} else {
	    /* This is for attributes only. */
	    clone = clone->parent;
	    parentClone = clone->parent;
	    /*
	    * Process parent-element --> children.
	    */
	    cur = cur->parent;
	    goto into_content;
	}
    }
    goto exit;

internal_error:
    ret = -1;

exit:
    /*
    * Cleanup.
    */
    if (nsMap != NULL) {
	if ((ctxt) && (ctxt->namespaceMap == nsMap)) {
	    /*
	    * Just cleanup the map but don't free.
	    */
	    if (nsMap->first) {
		if (nsMap->pool)
		    nsMap->last->next = nsMap->pool;
		nsMap->pool = nsMap->first;
		nsMap->first = NULL;
	    }
	} else
	    xmlDOMWrapNsMapFree(nsMap);
    }
    /*
    * TODO: Should we try a cleanup of the cloned node in case of a
    * fatal error?
    */
    *resNode = resultClone;
    return (ret);
}